

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExpressionPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionPatternSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ExpressionPatternSyntax *pEVar1;
  
  pEVar1 = (ExpressionPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionPatternSyntax *)this->endPtr < pEVar1 + 1) {
    pEVar1 = (ExpressionPatternSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pEVar1 + 1);
  }
  (pEVar1->super_PatternSyntax).super_SyntaxNode.kind = ExpressionPattern;
  (pEVar1->super_PatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar1->super_PatternSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }